

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O2

string * __thiscall
flatbuffers::Namer::File(string *__return_storage_ptr__,Namer *this,string *filename,SkipFile skips)

{
  allocator<char> local_9a;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ConvertCase(&local_58,filename,(this->config_).filenames,kUpperCamel);
  if ((skips & Suffix) == None) {
    std::__cxx11::string::string((string *)&local_78,(string *)&(this->config_).filename_suffix);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_99);
  }
  std::operator+(&local_38,&local_58,&local_78);
  if ((skips & Extension) == None) {
    std::__cxx11::string::string((string *)&local_98,(string *)&(this->config_).filename_extension);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_9a);
  }
  std::operator+(__return_storage_ptr__,&local_38,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string File(const std::string &filename,
                           SkipFile skips = SkipFile::None) const {
    const bool skip_suffix = (skips & SkipFile::Suffix) != SkipFile::None;
    const bool skip_ext = (skips & SkipFile::Extension) != SkipFile::None;
    return ConvertCase(filename, config_.filenames, Case::kUpperCamel) +
           (skip_suffix ? "" : config_.filename_suffix) +
           (skip_ext ? "" : config_.filename_extension);
  }